

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O2

bool __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::print_adj
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  __type _Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  
  iVar3 = 0;
  for (p_Var2 = (this->adj)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->adj)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var2 + 1),src);
    iVar3 = iVar3 + (uint)_Var1;
    p_Var4 = p_Var2 + 2;
    while (p_Var4 = *(_Rb_tree_node_base **)p_Var4, p_Var4 != p_Var2 + 2) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var4->_M_left,des);
      iVar3 = iVar3 + (uint)_Var1;
    }
  }
  return 1 < iVar3;
}

Assistant:

bool print_adj(ver src, ver des) {
      int f = 0;
      //Let try to print the adj list
      //Iterate over all the key value pairs in the map
      for (auto &j : adj) {
        f += j.first == src;
        //Iterator over the list of cities
        for (auto &l : j.second)
          f += l.first == des;
      }
      return f > 1;
    }